

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

ParseNode *
VisitBlock<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
          (ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,
          _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *prefix,
          _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *postfix,ParseNode *pnodeParent)

{
  ParseNode *pnode_00;
  bool bVar1;
  uint32 uVar2;
  FuncInfo *this;
  ParseNodeBin *pPVar3;
  ScriptContext *pSVar4;
  bool local_3a;
  bool local_39;
  ByteCodeGenerator *pBStack_38;
  bool fTrackVal;
  ParseNode *pnodeLastVal;
  ParseNode *pnodeParent_local;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *postfix_local;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *prefix_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *pnode_local;
  
  pBStack_38 = (ByteCodeGenerator *)0x0;
  if (pnode != (ParseNode *)0x0) {
    bVar1 = ByteCodeGenerator::IsBinding(byteCodeGenerator);
    local_3a = false;
    if (bVar1) {
      uVar2 = ByteCodeGenerator::GetFlags(byteCodeGenerator);
      local_3a = false;
      if ((uVar2 & 2) != 0) {
        this = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
        local_3a = FuncInfo::IsGlobalFunction(this);
      }
    }
    local_39 = local_3a;
    byteCodeGenerator_local = (ByteCodeGenerator *)pnode;
    while (*(char *)&byteCodeGenerator_local->scriptContext == 'P') {
      pPVar3 = ParseNode::AsParseNodeBin((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar3->pnode1,byteCodeGenerator,prefix,postfix,pnodeParent);
      if (local_39 != false) {
        pPVar3 = ParseNode::AsParseNodeBin((ParseNode *)byteCodeGenerator_local);
        pnode_00 = pPVar3->pnode1;
        pSVar4 = ByteCodeGenerator::GetScriptContext(byteCodeGenerator);
        bVar1 = MustProduceValue(pnode_00,pSVar4);
        if (bVar1) {
          pPVar3 = ParseNode::AsParseNodeBin((ParseNode *)byteCodeGenerator_local);
          pBStack_38 = (ByteCodeGenerator *)pPVar3->pnode1;
        }
        pPVar3 = ParseNode::AsParseNodeBin((ParseNode *)byteCodeGenerator_local);
        bVar1 = IsJump(pPVar3->pnode1);
        if (bVar1) {
          local_39 = false;
        }
      }
      pPVar3 = ParseNode::AsParseNodeBin((ParseNode *)byteCodeGenerator_local);
      byteCodeGenerator_local = (ByteCodeGenerator *)pPVar3->pnode2;
    }
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              ((ParseNode *)byteCodeGenerator_local,byteCodeGenerator,prefix,postfix,pnodeParent);
    if (local_39 != false) {
      pSVar4 = ByteCodeGenerator::GetScriptContext(byteCodeGenerator);
      bVar1 = MustProduceValue((ParseNode *)byteCodeGenerator_local,pSVar4);
      if (bVar1) {
        pBStack_38 = byteCodeGenerator_local;
      }
    }
  }
  return (ParseNode *)pBStack_38;
}

Assistant:

ParseNode* VisitBlock(ParseNode *pnode, ByteCodeGenerator* byteCodeGenerator, PrefixFn prefix, PostfixFn postfix, ParseNode *pnodeParent = nullptr)
{
    ParseNode *pnodeLastVal = nullptr;
    if (pnode != nullptr)
    {
        bool fTrackVal = byteCodeGenerator->IsBinding() &&
            (byteCodeGenerator->GetFlags() & fscrReturnExpression) &&
            byteCodeGenerator->TopFuncInfo()->IsGlobalFunction();
        while (pnode->nop == knopList)
        {
            Visit(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator, prefix, postfix, pnodeParent);
            if (fTrackVal)
            {
                // If we're tracking values, find the last statement (if any) in the block that is
                // guaranteed to produce a value.
                if (MustProduceValue(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator->GetScriptContext()))
                {
                    pnodeLastVal = pnode->AsParseNodeBin()->pnode1;
                }
                if (IsJump(pnode->AsParseNodeBin()->pnode1))
                {
                    // This is a jump out of the current block. The remaining instructions (if any)
                    // will not be executed, so stop tracking them.
                    fTrackVal = false;
                }
            }
            pnode = pnode->AsParseNodeBin()->pnode2;
        }
        Visit(pnode, byteCodeGenerator, prefix, postfix, pnodeParent);
        if (fTrackVal)
        {
            if (MustProduceValue(pnode, byteCodeGenerator->GetScriptContext()))
            {
                pnodeLastVal = pnode;
            }
        }
    }
    return pnodeLastVal;
}